

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O0

long __thiscall AmsRouter::GetLocalAddress(AmsRouter *this,uint16_t port,AmsAddr *pAddr)

{
  bool bVar1;
  reference this_00;
  lock_guard<std::recursive_mutex> local_30;
  lock_guard<std::recursive_mutex> lock;
  AmsAddr *pAddr_local;
  uint16_t port_local;
  AmsRouter *this_local;
  
  lock._M_device = (mutex_type *)pAddr;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_30,&this->mutex);
  if ((port < 30000) || (0x75af < port)) {
    this_local = (AmsRouter *)0x748;
  }
  else {
    this_00 = std::array<AmsPort,_128UL>::operator[](&this->ports,(long)(int)(port - 30000));
    bVar1 = AmsPort::IsOpen(this_00);
    if (bVar1) {
      ((lock._M_device)->super___recursive_mutex_base)._M_mutex.__data.__lock =
           *(int *)(this->localAddr).b;
      *(undefined2 *)((long)&((lock._M_device)->super___recursive_mutex_base)._M_mutex + 4) =
           *(undefined2 *)((this->localAddr).b + 4);
      *(uint16_t *)((long)&((lock._M_device)->super___recursive_mutex_base)._M_mutex + 6) = port;
      this_local = (AmsRouter *)0x0;
    }
    else {
      this_local = (AmsRouter *)0x748;
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_30);
  return (long)this_local;
}

Assistant:

long AmsRouter::GetLocalAddress(uint16_t port, AmsAddr* pAddr)
{
    std::lock_guard<std::recursive_mutex> lock(mutex);
    if ((port < PORT_BASE) || (port >= PORT_BASE + NUM_PORTS_MAX)) {
        return ADSERR_CLIENT_PORTNOTOPEN;
    }

    if (ports[port - PORT_BASE].IsOpen()) {
        memcpy(&pAddr->netId, &localAddr, sizeof(localAddr));
        pAddr->port = port;
        return 0;
    }
    return ADSERR_CLIENT_PORTNOTOPEN;
}